

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O3

void __thiscall SAUF<TTA>::FirstScan(SAUF<TTA> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long local_48;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar9 = (long)*(int *)&pMVar2->field_0x8;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < lVar9) {
    local_48 = -1;
    lVar10 = 0;
    do {
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar4 = *(long *)&pMVar2->field_0x10;
        lVar12 = **(long **)&pMVar2->field_0x48;
        lVar11 = lVar12 * lVar10 + lVar4;
        lVar8 = *(long *)&pMVar3->field_0x10;
        lVar13 = **(long **)&pMVar3->field_0x48;
        lVar14 = lVar13 * lVar10 + lVar8;
        lVar8 = lVar13 * local_48 + lVar8;
        lVar4 = lVar4 + lVar12 * local_48;
        lVar13 = 0;
        lVar12 = -1;
        do {
          if (*(char *)(lVar11 + 1 + lVar12) != '\0') {
            if (lVar10 == 0) {
              lVar6 = lVar12;
              if (lVar12 != -1) {
LAB_001ce862:
                if (*(char *)(lVar11 + lVar6) != '\0') {
                  uVar5 = *(uint *)(lVar14 + lVar6 * 4);
                  goto LAB_001ce8dc;
                }
              }
LAB_001ce8b4:
              uVar7 = (ulong)TTA::length_;
              TTA::rtable_[uVar7] = TTA::length_;
              TTA::next_[uVar7] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar5 = TTA::length_;
              TTA::length_ = TTA::length_ + 1;
            }
            else if (*(char *)(lVar4 + 1 + lVar12) == '\0') {
              if ((lVar12 + 1 < (long)(int)uVar1 + -1) && (*(char *)(lVar4 + 2 + lVar12) != '\0')) {
                if (lVar12 == -1) {
LAB_001ce94f:
                  uVar5 = *(uint *)(lVar8 + 8 + lVar12 * 4);
                }
                else {
                  if (*(char *)(lVar4 + lVar12) == '\0') {
                    if (*(char *)(lVar11 + lVar12) == '\0') goto LAB_001ce94f;
                    uVar5 = *(uint *)(lVar14 + lVar12 * 4);
                  }
                  else {
                    uVar5 = *(uint *)(lVar8 + lVar12 * 4);
                  }
                  uVar5 = TTA::Merge(uVar5,*(uint *)(lVar8 + 8 + lVar12 * 4));
                }
              }
              else {
                if (lVar12 == -1) goto LAB_001ce8b4;
                if (*(char *)(lVar4 + lVar12) == '\0') {
                  lVar6 = lVar13 + -1;
                  goto LAB_001ce862;
                }
                uVar5 = *(uint *)(lVar8 + lVar12 * 4);
              }
            }
            else {
              uVar5 = *(uint *)(lVar8 + 4 + lVar12 * 4);
            }
LAB_001ce8dc:
            *(uint *)(lVar14 + 4 + lVar12 * 4) = uVar5;
          }
          lVar13 = lVar13 + 1;
          lVar6 = lVar12 - (ulong)uVar1;
          lVar12 = lVar12 + 1;
        } while (lVar6 != -2);
      }
      lVar10 = lVar10 + 1;
      local_48 = local_48 + 1;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }